

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  Int32 IVar1;
  bool bVar2;
  char *str;
  long lVar3;
  ostream *poVar4;
  ostream *this;
  char *pcVar5;
  String SVar6;
  Int32 result;
  String env_var;
  Message local_68;
  Int32 local_5c;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58 [2];
  Int32 local_44;
  char *local_40;
  long local_38;
  
  FlagToEnvVar((internal *)&local_40,flag);
  pcVar5 = local_40;
  str = getenv(local_40);
  if (str != (char *)0x0) {
    local_5c = default_value;
    local_44 = default_value;
    Message::Message((Message *)local_58);
    poVar4 = (ostream *)(local_58[0].ptr_ + 0x10);
    if (local_58[0].ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Environment variable ",0x15);
    pcVar5 = local_40;
    poVar4 = (ostream *)(local_58[0].ptr_ + 0x10);
    if (local_58[0].ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    if (local_40 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(null)",6);
    }
    else if (local_38 != 0) {
      lVar3 = 0;
      do {
        if (pcVar5[lVar3] == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\\0",2);
        }
        else {
          local_68.ss_.ptr_._0_1_ = pcVar5[lVar3];
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_68,1);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != local_38);
    }
    bVar2 = ParseInt32((Message *)local_58,str,&local_5c);
    if (local_58[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58[0].ptr_ + 8))();
    }
    IVar1 = local_44;
    pcVar5 = local_40;
    default_value = local_5c;
    if (!bVar2) {
      Message::Message(&local_68);
      this = (ostream *)(CONCAT71(local_68.ss_.ptr_._1_7_,(char)local_68.ss_.ptr_) + 0x10);
      if (CONCAT71(local_68.ss_.ptr_._1_7_,(char)local_68.ss_.ptr_) == 0) {
        this = (ostream *)0x0;
      }
      std::ostream::operator<<(this,IVar1);
      SVar6 = StringStreamToString
                        ((internal *)local_58,
                         (stringstream *)CONCAT71(local_68.ss_.ptr_._1_7_,(char)local_68.ss_.ptr_));
      printf("The default value %s is used.\n",local_58[0].ptr_,SVar6.length_);
      if (local_58[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete__(local_58[0].ptr_);
      }
      if ((long *)CONCAT71(local_68.ss_.ptr_._1_7_,(char)local_68.ss_.ptr_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_68.ss_.ptr_._1_7_,(char)local_68.ss_.ptr_) + 8))();
      }
      fflush(_stdout);
      pcVar5 = local_40;
      default_value = IVar1;
    }
  }
  if (pcVar5 != (char *)0x0) {
    operator_delete__(pcVar5);
  }
  return default_value;
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
  const String env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == NULL) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
}